

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O2

void __thiscall
AbstractTransaction_CopyVariableBuffer_Test::TestBody
          (AbstractTransaction_CopyVariableBuffer_Test *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes;
  char *message;
  char *in_R9;
  AssertHelper AStack_98;
  AssertHelper local_90;
  AssertionResult gtest_ar_;
  string local_78;
  TestTransaction tx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  string test_data;
  
  TestTransaction::TestTransaction(&tx);
  std::__cxx11::string::string((string *)&test_data,"12345678",(allocator *)&local_78);
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gtest_ar_.success_ = TestTransaction::CopyVariableBufferTest(&tx,&test_data,&buffer);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&AStack_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)&gtest_ar_,
               (AssertionResult *)"tx.CopyVariableBufferTest(test_data, &buffer)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x137,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&AStack_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::StringUtil::ByteToString_abi_cxx11_((string *)&local_78,(StringUtil *)&buffer,bytes);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_,"StringUtil::ByteToString(buffer).c_str()","\"0412345678\"",
             local_78._M_dataplus._M_p,"0412345678");
  std::__cxx11::string::~string((string *)&local_78);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x138,message);
    testing::internal::AssertHelper::operator=(&AStack_98,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&AStack_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&test_data);
  cfd::core::AbstractTransaction::~AbstractTransaction(&tx.super_AbstractTransaction);
  return;
}

Assistant:

TEST(AbstractTransaction, CopyVariableBuffer) {
  TestTransaction tx;
  std::string test_data = "12345678";
  std::vector<uint8_t> buffer;
  EXPECT_TRUE(tx.CopyVariableBufferTest(test_data, &buffer));
  EXPECT_STREQ(StringUtil::ByteToString(buffer).c_str(), "0412345678");
}